

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph_algorithm.h
# Opt level: O1

void __thiscall
my_algorithm::WeightedDigraphSPAcyclic<int,_int>::_relax
          (WeightedDigraphSPAcyclic<int,_int> *this,WeightedDigraph<int,_int> *graph,Node *node)

{
  int iVar1;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar2;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar3;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar4;
  pointer pWVar5;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar6;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar7;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar8;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar9;
  out_of_range *poVar10;
  int iVar11;
  pointer pWVar12;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar13;
  vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  edges;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *local_90;
  size_t local_88;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *local_80;
  size_t local_78;
  int local_6c;
  vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  local_58;
  pointer local_38;
  
  pLVar6 = (this->_weight_to)._list._header;
  do {
    pLVar6 = pLVar6->_next;
    if (pLVar6 == (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0)
    goto LAB_00107bf0;
  } while ((pLVar6->element).key != (node->element).key);
  local_6c = (pLVar6->element).value;
LAB_00107bf0:
  if (pLVar6 == (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
    poVar10 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar10,"Key error, no such key in this table !");
    __cxa_throw(poVar10,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  local_58.
  super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar13 = (node->element).value._table._list._header;
  while (pWVar5 = local_58.
                  super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, pLVar13 = pLVar13->_next,
        pLVar13 !=
        (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
         *)0x0) {
    std::
    vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
    ::push_back(&local_58,&(pLVar13->element).value);
  }
  local_38 = local_58.
             super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_58.
      super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pLVar6 = (this->_weight_to)._list._header;
    pLVar2 = (this->_edge_to)._list._header;
    local_90 = (this->_edge_to)._list._tail;
    local_80 = (this->_weight_to)._list._tail;
    local_78 = (this->_weight_to)._list._size;
    local_88 = (this->_edge_to)._list._size;
    pWVar12 = local_58.
              super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar1 = (pWVar12->to->element).key;
      iVar11 = pWVar12->weight + local_6c;
      pLVar8 = pLVar6;
      do {
        pLVar8 = pLVar8->_next;
        pLVar7 = pLVar6;
        pLVar9 = pLVar2;
        if (pLVar8 == (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0)
        goto LAB_00107ced;
      } while ((pLVar8->element).key != iVar1);
      if (pLVar8 == (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
LAB_00107ced:
        do {
          pLVar7 = pLVar7->_next;
          if (pLVar7 == (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
            pLVar8 = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)operator_new(0x20);
            pLVar8->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010dbd8;
            (pLVar8->element)._vptr_SymbolTableElement =
                 (_func_int **)&PTR__SymbolTableElement_0010dc08;
            (pLVar8->element).key = iVar1;
            (pLVar8->element).value = iVar11;
            pLVar8->_next = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0;
            pLVar8->_next = local_80->_next;
            local_80->_next = pLVar8;
            local_78 = local_78 + 1;
            (this->_weight_to)._list._size = local_78;
            (this->_weight_to)._list._tail = pLVar8;
            local_80 = pLVar8;
            goto LAB_00107d63;
          }
        } while ((pLVar7->element).key != iVar1);
        (pLVar7->element).value = iVar11;
LAB_00107d63:
        do {
          pLVar9 = pLVar9->_next;
          if (pLVar9 == (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                         *)0x0) {
            pRVar3 = pWVar12->from;
            pRVar4 = pWVar12->to;
            iVar11 = pWVar12->weight;
            pLVar9 = (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                      *)operator_new(0x38);
            pLVar9->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010db18;
            (pLVar9->element)._vptr_SymbolTableElement =
                 (_func_int **)&PTR__SymbolTableElement_0010db48;
            (pLVar9->element).value.from =
                 (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                  *)0x0;
            (pLVar9->element).value.to =
                 (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                  *)0x0;
            (pLVar9->element).key = iVar1;
            (pLVar9->element).value.from = pRVar3;
            (pLVar9->element).value.to = pRVar4;
            (pLVar9->element).value.weight = iVar11;
            goto LAB_00107dca;
          }
        } while ((pLVar9->element).key != iVar1);
LAB_00107d72:
        (pLVar9->element).value.from = pWVar12->from;
        (pLVar9->element).value.to = pWVar12->to;
        (pLVar9->element).value.weight = pWVar12->weight;
      }
      else {
        do {
          pLVar7 = pLVar7->_next;
          if (pLVar7 == (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0)
          goto LAB_00107cbb;
        } while ((pLVar7->element).key != iVar1);
        pLVar8 = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)
                 (ulong)(uint)(pLVar7->element).value;
LAB_00107cbb:
        if (pLVar7 == (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
          poVar10 = (out_of_range *)__cxa_allocate_exception(0x10);
          std::out_of_range::out_of_range(poVar10,"Key error, no such key in this table !");
          __cxa_throw(poVar10,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
        }
        pLVar7 = pLVar6;
        if (iVar11 < (int)pLVar8) {
          do {
            pLVar7 = pLVar7->_next;
            if (pLVar7 == (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
              pLVar8 = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)
                       operator_new(0x20);
              pLVar8->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010dbd8;
              (pLVar8->element)._vptr_SymbolTableElement =
                   (_func_int **)&PTR__SymbolTableElement_0010dc08;
              (pLVar8->element).key = iVar1;
              (pLVar8->element).value = iVar11;
              pLVar8->_next = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0;
              pLVar8->_next = local_80->_next;
              local_80->_next = pLVar8;
              local_78 = local_78 + 1;
              (this->_weight_to)._list._size = local_78;
              (this->_weight_to)._list._tail = pLVar8;
              local_80 = pLVar8;
              goto LAB_00107e77;
            }
          } while ((pLVar7->element).key != iVar1);
          (pLVar7->element).value = iVar11;
LAB_00107e77:
          pLVar9 = pLVar9->_next;
          if (pLVar9 != (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                         *)0x0) goto code_r0x00107e80;
          pRVar3 = pWVar12->from;
          pRVar4 = pWVar12->to;
          iVar11 = pWVar12->weight;
          pLVar9 = (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                    *)operator_new(0x38);
          pLVar9->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010db18;
          (pLVar9->element)._vptr_SymbolTableElement =
               (_func_int **)&PTR__SymbolTableElement_0010db48;
          (pLVar9->element).value.from =
               (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                *)0x0;
          (pLVar9->element).value.to =
               (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                *)0x0;
          (pLVar9->element).key = iVar1;
          (pLVar9->element).value.from = pRVar3;
          (pLVar9->element).value.to = pRVar4;
          (pLVar9->element).value.weight = iVar11;
LAB_00107dca:
          pLVar9->_next =
               (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                *)0x0;
          pLVar9->_next = local_90->_next;
          local_90->_next = pLVar9;
          local_88 = local_88 + 1;
          (this->_edge_to)._list._size = local_88;
          (this->_edge_to)._list._tail = pLVar9;
          local_90 = pLVar9;
        }
      }
      pWVar12 = pWVar12 + 1;
    } while (pWVar12 != local_38);
  }
  if (pWVar5 != (pointer)0x0) {
    operator_delete(pWVar5,(long)local_58.
                                 super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pWVar5);
  }
  return;
code_r0x00107e80:
  if ((pLVar9->element).key == iVar1) goto LAB_00107d72;
  goto LAB_00107e77;
}

Assistant:

void _relax(WeightedDigraph<T, Weight> &graph, Node* node) {
            auto vertex = node->element.key;
            auto weight = _weight_to.get(vertex);
            auto edges = node->element.value.adjEdges();
            for (auto &edge: edges) {
                auto to_vertex = edge.to->element.key;
                auto new_weight = weight + edge.weight;
                if (!_weight_to.has(to_vertex)) {
                    _weight_to.set(to_vertex, new_weight);
                    _edge_to.set(to_vertex, edge);
                    continue;
                }
                if (_weight_to.get(to_vertex) > new_weight) {
                    _weight_to.set(to_vertex, new_weight);
                    _edge_to.set(to_vertex, edge);
                }
            }
        }